

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O3

int mm_validate_table_fsize(uint8_t table_id,FILE *stream,unsigned_long expected_size)

{
  unsigned_long uVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = 0;
  fseek((FILE *)stream,0,2);
  uVar1 = ftell((FILE *)stream);
  fseek((FILE *)stream,0,0);
  if (uVar1 != expected_size) {
    uVar2 = (uint)table_id;
    if (0xaf < table_id) {
      uVar2 = 0;
    }
    printf("Incorrect length for %s table, expected: %lu bytes, actual: %zd bytes.\n",
           table_string[uVar2],expected_size,uVar1);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int mm_validate_table_fsize(uint8_t table_id, FILE *stream, unsigned long expected_size)
{
    size_t actual_size;
    fseek(stream, 0, SEEK_END);
    actual_size = ftell(stream);
    fseek(stream, 0, SEEK_SET);

    if (actual_size != (expected_size)) {
        printf("Incorrect length for %s table, expected: %lu bytes, actual: %zd bytes.\n",
            table_to_string(table_id),
            expected_size,
            actual_size);
        return (-1);
    }

    return (0);
}